

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

void __thiscall CVmUndo::undo_to_savept(CVmUndo *this)

{
  CVmObjTable *this_00;
  CVmUndoRecord *in_RDI;
  CVmUndoMeta *meta;
  
  if (*(int *)&in_RDI->field_0x4 != 0) {
    this_00 = *(CVmObjTable **)(in_RDI + 1);
    while( true ) {
      if (this_00 == (CVmObjTable *)in_RDI[1].id.ptrval) {
        this_00 = (CVmObjTable *)((long)in_RDI[1].id.ptrval + *(long *)&in_RDI[1].oldval * 0x20);
      }
      this_00 = (CVmObjTable *)((long)(this_00 + 0xffffffffffffffff) + 0x60);
      if (this_00 == *(CVmObjTable **)&in_RDI->oldval) break;
      CVmObjTable::apply_undo(this_00,in_RDI);
    }
    *(undefined8 *)&in_RDI->oldval = **(undefined8 **)&in_RDI->oldval;
    if (*(long *)&in_RDI->oldval == 0) {
      (in_RDI->oldval).val.ptr = (void *)0x0;
    }
    else {
      *(undefined8 *)(*(long *)&in_RDI->oldval + 8) = 0;
    }
    *(int *)&in_RDI->field_0x4 = *(int *)&in_RDI->field_0x4 + -1;
    *(char *)&in_RDI->obj = (char)in_RDI->obj + -1;
    if ((char)in_RDI->obj == '\0') {
      *(undefined1 *)&in_RDI->obj = 0xff;
    }
    *(CVmObjTable **)(in_RDI + 1) = this_00;
    CVmObjTable::notify_new_savept((CVmObjTable *)this);
  }
  return;
}

Assistant:

void CVmUndo::undo_to_savept(VMG0_)
{
    CVmUndoMeta *meta;
    
    /* if we don't have any savepoints, there's nothing to do */
    if (savept_cnt_ == 0)
        return;

    /* 
     *   Starting with the most recently-added record, apply each record
     *   in sequence until we reach the first savepoint in the undo list.  
     */
    meta = next_free_;
    for (;;)
    {
        /* 
         *   move to the previous record, wrapping to the end of the array
         *   at the first record (since we treat the array as circular) 
         */
        if (meta == rec_arr_)
            meta = rec_arr_ + rec_arr_size_;
        --meta;

        /* 
         *   if we're at the first record in the current savepoint, we're
         *   done 
         */
        if (meta == cur_first_)
            break;

        /* apply this undo record */
        G_obj_table->apply_undo(vmg_ &meta->rec);
    }

    /*
     *   Unwind the undo stack -- get the first record in the previous
     *   savepoint from the link pointer. 
     */
    cur_first_ = cur_first_->link.prev_first;

    /* 
     *   there's nothing following the current savepoint any more -- the
     *   savepoint we just applied is gone now 
     */
    if (cur_first_ != 0)
        cur_first_->link.next_first = 0;
    else
        oldest_first_ = 0;

    /* that's one less savepoint */
    --savept_cnt_;

    /* make the previous savepoint current */
    --cur_savept_;
    if (cur_savept_ == 0)
        cur_savept_ = VM_SAVEPT_MAX;

    /* the savepoint link we just removed is now the next free record */
    next_free_ = meta;

    /* 
     *   notify objects that a new savepoint is in effect - the savepoint
     *   isn't new in the sense of being newly created, but in the sense of
     *   being a different savepoint than was previously in effect 
     */
    G_obj_table->notify_new_savept();
}